

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::CaptureGeometryInterleaved::buildProgram
          (CaptureGeometryInterleaved *this,GLuint primitive_case)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  GLchar *pGVar1;
  GLchar *vertex_shader_source;
  undefined8 gl_00;
  int iVar2;
  GLuint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar5;
  value_type pcVar6;
  reference ppcVar7;
  TestContext *this_01;
  TestLog *log;
  GLchar *geometry_shader_source;
  undefined4 *puVar8;
  GLint i_00;
  GLint i_01;
  GLint i_02;
  GLint i_03;
  GLint i_04;
  char *pcVar9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  allocator<char> local_339;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  string local_290;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  allocator<char> local_119;
  string local_118 [8];
  string varying;
  GLint i;
  GLint all_transform_feedback_interleaved_varyings_count;
  GLint user_defined_transform_feedback_interleaved_varyings_count;
  vector<const_char_*,_std::allocator<const_char_*>_> transform_feedback_varyings_c;
  undefined1 local_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transform_feedback_varyings;
  string local_a8 [8];
  string transform_feedback_variable_setters;
  string local_80 [8];
  string transform_feedback_variable_declarations;
  allocator<char> local_49;
  string local_48 [8];
  string geometry_shader;
  Functions *gl;
  GLuint primitive_case_local;
  CaptureGeometryInterleaved *this_local;
  
  pRVar4 = deqp::Context::getRenderContext
                     (*(Context **)
                       (&this->field_0x78 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  pGVar1 = s_geometry_shader_source_code_template;
  geometry_shader.field_2._8_8_ = CONCAT44(extraout_var,iVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,pGVar1,&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,"",
             (allocator<char> *)(transform_feedback_variable_setters.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(transform_feedback_variable_setters.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"",
             (allocator<char> *)
             ((long)&transform_feedback_varyings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&transform_feedback_varyings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = *(int *)(&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]);
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&transform_feedback_varyings_c.
                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c8,(long)iVar2,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&transform_feedback_varyings_c.
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7));
  iVar2 = *(int *)(&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]);
  std::allocator<const_char_*>::allocator
            ((allocator<const_char_*> *)
             ((long)&all_transform_feedback_interleaved_varyings_count + 3));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             &user_defined_transform_feedback_interleaved_varyings_count,(long)iVar2,
             (allocator<const_char_*> *)
             ((long)&all_transform_feedback_interleaved_varyings_count + 3));
  std::allocator<const_char_*>::~allocator
            ((allocator<const_char_*> *)
             ((long)&all_transform_feedback_interleaved_varyings_count + 3));
  varying.field_2._12_4_ =
       *(int *)(&this->field_0x98 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) / 4;
  iVar2 = varying.field_2._12_4_ + -1;
  for (varying.field_2._8_4_ = 0; (int)varying.field_2._8_4_ < iVar2;
      varying.field_2._8_4_ = varying.field_2._8_4_ + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_118,"result_",&local_119);
    std::allocator<char>::~allocator(&local_119);
    Utilities::itoa_abi_cxx11_(&local_140,(Utilities *)(ulong)(uint)varying.field_2._8_4_,i_00);
    std::__cxx11::string::append(local_118);
    std::__cxx11::string::~string((string *)&local_140);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_c8,(long)(int)varying.field_2._8_4_);
    std::__cxx11::string::operator=((string *)pvVar5,local_118);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c8,(long)(int)varying.field_2._8_4_);
    pcVar6 = (value_type)std::__cxx11::string::c_str();
    ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         &user_defined_transform_feedback_interleaved_varyings_count,
                         (long)(int)varying.field_2._8_4_);
    *ppcVar7 = pcVar6;
    std::__cxx11::string::append((char *)local_80);
    std::__cxx11::string::append(local_80);
    std::__cxx11::string::append((char *)local_80);
    std::__cxx11::string::append((char *)local_a8);
    std::__cxx11::string::append(local_a8);
    std::__cxx11::string::append((char *)local_a8);
    Utilities::itoa_abi_cxx11_
              (&local_160,(Utilities *)(ulong)(uint)(varying.field_2._8_4_ << 2),i_01);
    std::__cxx11::string::append(local_a8);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::append((char *)local_a8);
    Utilities::itoa_abi_cxx11_(&local_180,(Utilities *)(ulong)(varying.field_2._8_4_ * 4 + 1),i_02);
    std::__cxx11::string::append(local_a8);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::append((char *)local_a8);
    Utilities::itoa_abi_cxx11_(&local_1a0,(Utilities *)(ulong)(varying.field_2._8_4_ * 4 + 2),i_03);
    std::__cxx11::string::append(local_a8);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::append((char *)local_a8);
    Utilities::itoa_abi_cxx11_(&local_1c0,(Utilities *)(ulong)(varying.field_2._8_4_ * 4 + 3),i_04);
    std::__cxx11::string::append(local_a8);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::append((char *)local_a8);
    std::__cxx11::string::~string(local_118);
  }
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_c8,(long)iVar2);
  std::__cxx11::string::operator=((string *)pvVar5,"gl_Position");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c8,(long)iVar2);
  pcVar6 = (value_type)std::__cxx11::string::c_str();
  ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                       &user_defined_transform_feedback_interleaved_varyings_count,(long)iVar2);
  *ppcVar7 = pcVar6;
  std::__cxx11::string::string((string *)&local_200,local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"TEMPLATE_PRIMITIVE_TYPE",&local_221);
  pcVar9 = s_geometry_interleaved_primitive_cases[primitive_case];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,pcVar9,&local_249);
  Utilities::preprocessCode(&local_1e0,&local_200,&local_220,&local_248);
  std::__cxx11::string::operator=(local_48,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string((string *)&local_290,local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"TEMPLATE_INPUT_OUTPUT_DECLARATIONS",&local_2b1);
  std::__cxx11::string::string((string *)&local_2d8,local_80);
  Utilities::preprocessCode(&local_270,&local_290,&local_2b0,&local_2d8);
  std::__cxx11::string::operator=(local_48,(string *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_318,local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"TEMPLATE_OUTPUT_SETTERS",&local_339);
  std::__cxx11::string::string((string *)&local_360,local_a8);
  Utilities::preprocessCode(&local_2f8,&local_318,&local_338,&local_360);
  std::__cxx11::string::operator=(local_48,(string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::string((string *)&local_3a0,local_48);
  std::allocator<char>::allocator();
  pcVar9 = "TEMPLATE_RASTERIZATION_EPSILON";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"TEMPLATE_RASTERIZATION_EPSILON",&local_3c1);
  Utilities::ftoa_abi_cxx11_(&local_3e8,(Utilities *)pcVar9,0.0625);
  Utilities::preprocessCode(&local_380,&local_3a0,&local_3c0,&local_3e8);
  std::__cxx11::string::operator=(local_48,(string *)&local_380);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string((string *)&local_3a0);
  gl_00 = geometry_shader.field_2._8_8_;
  this_01 = deqp::Context::getTestContext
                      (*(Context **)
                        (&this->field_0x78 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
  log = tcu::TestContext::getLog(this_01);
  geometry_shader_source = (GLchar *)std::__cxx11::string::c_str();
  vertex_shader_source = s_blank_vertex_shader_source_code;
  pGVar1 = CaptureVertexInterleaved::s_fragment_shader_source_code;
  ppcVar7 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                       &user_defined_transform_feedback_interleaved_varyings_count,0);
  GVar3 = Utilities::buildProgram
                    ((Functions *)gl_00,log,geometry_shader_source,(GLchar *)0x0,(GLchar *)0x0,
                     vertex_shader_source,pGVar1,ppcVar7,varying.field_2._12_4_,
                     *(GLenum *)
                      (&this->field_0x9c + (long)this->_vptr_CaptureGeometryInterleaved[-3]),false,
                     (GLint *)0x0);
  *(GLuint *)(&this->field_0x80 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) = GVar3;
  if (*(int *)(&this->field_0x80 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) == 0) {
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0;
    __cxa_throw(puVar8,&int::typeinfo,0);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             &user_defined_transform_feedback_interleaved_varyings_count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureGeometryInterleaved::buildProgram(glw::GLuint primitive_case)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Preparing source code. */
	std::string geometry_shader(s_geometry_shader_source_code_template); /* Storage for vertex shader source code. */
	std::string transform_feedback_variable_declarations(
		""); /* String to contain all custom outputs from vertex shader. */
	std::string transform_feedback_variable_setters(
		""); /* String containing all initializations of custom outputs from vertex shader. */
	std::vector<std::string> transform_feedback_varyings(m_max_transform_feedback_components); /* Varyings array. */
	std::vector<const glw::GLchar*> transform_feedback_varyings_c(
		m_max_transform_feedback_components); /* Varyings array in C form to pass to the GL. */

	glw::GLint user_defined_transform_feedback_interleaved_varyings_count =
		m_max_transform_feedback_components /* total max to be written by the shader */
			/ 4								/* components per vec4 */
		//                                                                          / 4 /* number of vertices */
		- 1 /* gl_Position */;

	glw::GLint all_transform_feedback_interleaved_varyings_count =
		user_defined_transform_feedback_interleaved_varyings_count + 1 /* gl_Position */;

	/* Most of varyings is declarated output variables. */
	for (glw::GLint i = 0; i < user_defined_transform_feedback_interleaved_varyings_count; ++i)
	{
		/* Preparing variable name. */
		std::string varying = "result_";
		varying.append(gl3cts::TransformFeedback::Utilities::itoa(i));

		transform_feedback_varyings[i] = varying;

		transform_feedback_varyings_c[i] = transform_feedback_varyings[i].c_str();

		/* Preparing variable declaration. */
		transform_feedback_variable_declarations.append("out vec4 ");
		transform_feedback_variable_declarations.append(varying);
		transform_feedback_variable_declarations.append(";\n");

		/* Preparing variable setters. */
		transform_feedback_variable_setters.append("    ");
		transform_feedback_variable_setters.append(varying);
		transform_feedback_variable_setters.append(" = vec4(");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 1));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 2));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 3));
		transform_feedback_variable_setters.append(".0);\n");
	}

	/* Last four varying components are gl_Position components. */
	transform_feedback_varyings[user_defined_transform_feedback_interleaved_varyings_count /* gl_Position */] =
		"gl_Position";

	transform_feedback_varyings_c[user_defined_transform_feedback_interleaved_varyings_count /* gl_Position */] =
		transform_feedback_varyings[user_defined_transform_feedback_interleaved_varyings_count /* gl_Position */]
			.c_str();

	/* Preprocess vertex shader source code template. */
	geometry_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		geometry_shader, "TEMPLATE_PRIMITIVE_TYPE", s_geometry_interleaved_primitive_cases[primitive_case]);
	geometry_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		geometry_shader, "TEMPLATE_INPUT_OUTPUT_DECLARATIONS", transform_feedback_variable_declarations);
	geometry_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(geometry_shader, "TEMPLATE_OUTPUT_SETTERS",
																		   transform_feedback_variable_setters);
	geometry_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		geometry_shader, "TEMPLATE_RASTERIZATION_EPSILON",
		gl3cts::TransformFeedback::Utilities::ftoa(s_rasterization_epsilon));

	/* Compile, link and check. */
	m_program = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), geometry_shader.c_str(), NULL, NULL, s_blank_vertex_shader_source_code,
		s_fragment_shader_source_code, &transform_feedback_varyings_c[0],
		all_transform_feedback_interleaved_varyings_count, m_attrib_type);

	if (0 == m_program)
	{
		throw 0;
	}
}